

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.cpp
# Opt level: O2

string * __thiscall
duckdb::TableRef::BaseToString
          (string *__return_storage_ptr__,TableRef *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_name_alias)

{
  string local_40;
  
  AliasToString(&local_40,this,column_name_alias);
  ::std::__cxx11::string::append((string *)result);
  ::std::__cxx11::string::~string((string *)&local_40);
  SampleToString_abi_cxx11_(&local_40,this);
  ::std::__cxx11::string::append((string *)result);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)result);
  return __return_storage_ptr__;
}

Assistant:

string TableRef::BaseToString(string result, const vector<string> &column_name_alias) const {
	result += AliasToString(column_name_alias);
	result += SampleToString();
	return result;
}